

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mongoose.c
# Opt level: O3

void call_http_client_handler(connection *conn)

{
  size_t *psVar1;
  mg_handler_t p_Var2;
  ulong uVar3;
  ulong uVar4;
  char *__dest;
  int iVar5;
  ns_connection *pnVar6;
  
  pnVar6 = conn->ns_conn;
  if (conn->cl == 0) {
    (conn->mg_conn).content_len = (pnVar6->recv_iobuf).len;
  }
  (conn->mg_conn).content = (pnVar6->recv_iobuf).buf;
  if ((conn->server != (mg_server *)0x0) &&
     (p_Var2 = conn->server->event_handler, p_Var2 != (mg_handler_t)0x0)) {
    iVar5 = (*p_Var2)(&conn->mg_conn,MG_REPLY);
    pnVar6 = conn->ns_conn;
    if (iVar5 != 0) goto LAB_0010e220;
  }
  *(byte *)&pnVar6->flags = (byte)pnVar6->flags | 0x10;
LAB_0010e220:
  uVar3 = (conn->mg_conn).content_len;
  if ((uVar3 != 0) && (uVar4 = (pnVar6->recv_iobuf).len, uVar3 <= uVar4)) {
    __dest = (pnVar6->recv_iobuf).buf;
    memmove(__dest,__dest + uVar3,uVar4 - uVar3);
    psVar1 = &(pnVar6->recv_iobuf).len;
    *psVar1 = *psVar1 - uVar3;
  }
  (conn->mg_conn).status_code = 0;
  conn->num_bytes_recv = 0;
  conn->cl = 0;
  conn->request_len = 0;
  free(conn->request);
  conn->request = (char *)0x0;
  return;
}

Assistant:

static void call_http_client_handler(struct connection *conn) {
  //conn->mg_conn.status_code = code;
  // For responses without Content-Lengh, use the whole buffer
  if (conn->cl == 0) {
    conn->mg_conn.content_len = conn->ns_conn->recv_iobuf.len;
  }
  conn->mg_conn.content = conn->ns_conn->recv_iobuf.buf;
  if (call_user(conn, MG_REPLY) == MG_FALSE) {
    conn->ns_conn->flags |= NSF_CLOSE_IMMEDIATELY;
  }
  iobuf_remove(&conn->ns_conn->recv_iobuf, conn->mg_conn.content_len);
  conn->mg_conn.status_code = 0;
  conn->cl = conn->num_bytes_recv = conn->request_len = 0;
  free(conn->request);
  conn->request = NULL;
}